

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O2

void __thiscall TypeDeclarator::~TypeDeclarator(TypeDeclarator *this)

{
  pointer ppTVar1;
  TypeModifier *pTVar2;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppTVar1 = (this->mods).super__Vector_base<TypeModifier_*,_std::allocator<TypeModifier_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->mods).
                      super__Vector_base<TypeModifier_*,_std::allocator<TypeModifier_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= (ulong)uVar3)
    break;
    pTVar2 = ppTVar1[uVar3];
    if (pTVar2 != (TypeModifier *)0x0) {
      (*pTVar2->_vptr_TypeModifier[1])();
    }
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::~string((string *)&this->model);
  std::__cxx11::string::~string((string *)&this->ident);
  std::_Vector_base<TypeModifier_*,_std::allocator<TypeModifier_*>_>::~_Vector_base
            ((_Vector_base<TypeModifier_*,_std::allocator<TypeModifier_*>_> *)this);
  return;
}

Assistant:

TypeDeclarator::~TypeDeclarator(void)

{
  for(uint4 i=0;i<mods.size();++i)
    delete mods[i];
}